

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_dev.cpp
# Opt level: O1

string * VersionString_abi_cxx11_(string *__return_storage_ptr__,int version)

{
  ostream *this;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (version != 0) {
    this = (ostream *)std::ostream::operator<<(local_190,version >> 4);
    std::__ostream_insert<char,std::char_traits<char>>(this,".",1);
    std::ostream::operator<<((ostream *)this,version & 0xf);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string VersionString(int version)
{
    std::stringstream ss;
    if (version)
        ss << (version >> 4) << "." << (version & 0xf);
    return ss.str();
}